

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareFieldValueUsingParentFields
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *field,int index1,int index2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  byte bVar2;
  int iVar3;
  Message *pMVar4;
  SpecificField *specific_field;
  byte bVar5;
  bool bVar6;
  Reflection *this_00;
  Reflection *this_01;
  Message *message1_00;
  Metadata MVar8;
  FieldContext field_context;
  MessageDifferencer MStack_230;
  Reflection *pRStack_80;
  Reflection *pRStack_78;
  FieldDescriptor *pFStack_70;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  **local_68;
  int local_5c;
  Message *local_58;
  MessageDifferencer *local_50;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_48 [3];
  ulong uVar7;
  
  local_68 = local_48;
  local_48[0] = parent_fields;
  pFStack_70 = (FieldDescriptor *)0x310a05;
  local_5c = unpacked_any;
  iVar3 = (*(((this->field_comparator_).default_impl)->super_SimpleFieldComparator).
            super_FieldComparator._vptr_FieldComparator[2])();
  if ((iVar3 != 2) || (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10)
     ) {
    return iVar3 == 0;
  }
  pFStack_70 = (FieldDescriptor *)0x310a29;
  local_50 = this;
  MVar8 = Message::GetMetadata(message1);
  this_00 = MVar8.reflection;
  pFStack_70 = (FieldDescriptor *)0x310a34;
  MVar8 = Message::GetMetadata(message2);
  this_01 = MVar8.reflection;
  bVar2 = field->field_0x1;
  bVar5 = (bVar2 & 0x20) >> 5;
  uVar7 = (ulong)bVar5;
  if (0xbf < bVar2 == (bool)bVar5) {
    if ((bVar2 & 0x20) == 0) {
      pFStack_70 = (FieldDescriptor *)0x310a77;
      local_58 = Reflection::GetMessage(this_00,message1,field,(MessageFactory *)0x0);
    }
    else {
      pFStack_70 = (FieldDescriptor *)0x310a64;
      local_58 = Reflection::GetRepeatedMessage(this_00,message1,field,index1);
    }
    bVar5 = field->field_0x1;
    bVar6 = (bool)((bVar5 & 0x20) >> 5);
    uVar7 = (ulong)bVar6;
    if (0xbf < bVar5 == bVar6) {
      if ((bVar5 & 0x20) == 0) {
        pFStack_70 = (FieldDescriptor *)0x310ac1;
        pMVar4 = Reflection::GetMessage(this_01,message2,field,(MessageFactory *)0x0);
      }
      else {
        pFStack_70 = (FieldDescriptor *)0x310aaf;
        pMVar4 = Reflection::GetRepeatedMessage(this_01,message2,field,index2);
      }
      if (parent_fields !=
          (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           *)0x0) {
        pFStack_70 = (FieldDescriptor *)0x310ad6;
        specific_field = PushSpecificField(parent_fields);
        specific_field->message1 = message1;
        specific_field->message2 = message2;
        specific_field->unpacked_any = local_5c;
        specific_field->field = field;
        pFStack_70 = (FieldDescriptor *)0x310afc;
        AddSpecificIndex(specific_field,message1,field,index1);
        pFStack_70 = (FieldDescriptor *)0x310b0e;
        AddSpecificNewIndex(specific_field,message2,field,index2);
        pFStack_70 = (FieldDescriptor *)0x310b2a;
        bVar6 = Compare(local_50,local_58,pMVar4,0,parent_fields);
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        return bVar6;
      }
      pFStack_70 = (FieldDescriptor *)0x310b43;
      bVar6 = Compare(local_50,local_58,pMVar4);
      return bVar6;
    }
  }
  else {
    pFStack_70 = (FieldDescriptor *)0x310b67;
    CompareFieldValueUsingParentFields();
  }
  pMVar4 = (Message *)(ulong)(0xbf < bVar5);
  message1_00 = (Message *)(uVar7 & 0xff);
  pFStack_70 = (FieldDescriptor *)Equals;
  CompareFieldValueUsingParentFields();
  pRStack_80 = this_00;
  pRStack_78 = this_01;
  pFStack_70 = field;
  MessageDifferencer(&MStack_230);
  bVar6 = Compare(&MStack_230,message1_00,pMVar4);
  ~MessageDifferencer(&MStack_230);
  return bVar6;
}

Assistant:

bool MessageDifferencer::CompareFieldValueUsingParentFields(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* field, int index1, int index2,
    std::vector<SpecificField>* parent_fields) {
  FieldContext field_context(parent_fields);
  FieldComparator::ComparisonResult result = GetFieldComparisonResult(
      message1, message2, field, index1, index2, &field_context);

  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      result == FieldComparator::RECURSE) {
    // Get the nested messages and compare them using one of the Compare
    // methods.
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const Message& m1 =
        field->is_repeated()
            ? reflection1->GetRepeatedMessage(message1, field, index1)
            : reflection1->GetMessage(message1, field);
    const Message& m2 =
        field->is_repeated()
            ? reflection2->GetRepeatedMessage(message2, field, index2)
            : reflection2->GetMessage(message2, field);

    // parent_fields is used in calls to Reporter methods.
    if (parent_fields != NULL) {
      // Append currently compared field to the end of parent_fields.
      SpecificField& specific_field = PushSpecificField(parent_fields);
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      AddSpecificIndex(&specific_field, message1, field, index1);
      AddSpecificNewIndex(&specific_field, message2, field, index2);
      const bool compare_result = Compare(m1, m2, false, parent_fields);
      parent_fields->pop_back();
      return compare_result;
    } else {
      // Recreates parent_fields as if m1 and m2 had no parents.
      return Compare(m1, m2);
    }
  } else {
    return (result == FieldComparator::SAME);
  }
}